

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O3

UBool __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::preceding
          (DictionaryCache *this,int32_t fromPos,int32_t *result,int32_t *statusIndex)

{
  uint uVar1;
  int iVar2;
  int32_t *piVar3;
  uint uVar4;
  int32_t iVar5;
  uint uVar6;
  
  if ((fromPos <= this->fStart) || (this->fLimit < fromPos)) {
LAB_0029d5f6:
    this->fPositionInCache = -1;
    return '\0';
  }
  if (this->fLimit == fromPos) {
    uVar4 = (this->fBreaks).count - 1;
    this->fPositionInCache = uVar4;
  }
  else {
    uVar4 = this->fPositionInCache;
  }
  if ((int)uVar4 < 1) {
    if (uVar4 == 0) goto LAB_0029d5f6;
    uVar6 = (this->fBreaks).count;
  }
  else {
    uVar6 = (this->fBreaks).count;
    if (((int)uVar4 < (int)uVar6) && (piVar3 = (this->fBreaks).elements, piVar3[uVar4] == fromPos))
    {
      this->fPositionInCache = uVar4 - 1;
      iVar2 = piVar3[uVar4 - 1];
      *result = iVar2;
      iVar5 = (&this->fFirstRuleStatusIndex)[iVar2 != this->fStart];
      goto LAB_0029d686;
    }
  }
  piVar3 = (this->fBreaks).elements;
  uVar4 = uVar6;
  do {
    uVar1 = uVar4 - 1;
    this->fPositionInCache = uVar1;
    if ((int)uVar4 < 1) goto LAB_0029d5f6;
    iVar5 = 0;
    if ((int)uVar4 <= (int)uVar6) {
      iVar5 = piVar3[uVar1];
    }
    uVar4 = uVar1;
  } while (fromPos <= iVar5);
  *result = iVar5;
  iVar5 = (&this->fFirstRuleStatusIndex)[iVar5 != this->fStart];
LAB_0029d686:
  *statusIndex = iVar5;
  return '\x01';
}

Assistant:

UBool RuleBasedBreakIterator::DictionaryCache::preceding(int32_t fromPos, int32_t *result, int32_t *statusIndex) {
    if (fromPos <= fStart || fromPos > fLimit) {
        fPositionInCache = -1;
        return FALSE;
    }

    if (fromPos == fLimit) {
        fPositionInCache = fBreaks.size() - 1;
        if (fPositionInCache >= 0) {
            U_ASSERT(fBreaks.elementAti(fPositionInCache) == fromPos);
        }
    }

    int32_t r;
    if (fPositionInCache > 0 && fPositionInCache < fBreaks.size() && fBreaks.elementAti(fPositionInCache) == fromPos) {
        --fPositionInCache;
        r = fBreaks.elementAti(fPositionInCache);
        U_ASSERT(r < fromPos);
        *result = r;
        *statusIndex = ( r== fStart) ? fFirstRuleStatusIndex : fOtherRuleStatusIndex;
        return TRUE;
    }

    if (fPositionInCache == 0) {
        fPositionInCache = -1;
        return FALSE;
    }

    for (fPositionInCache = fBreaks.size()-1; fPositionInCache >= 0; --fPositionInCache) {
        r = fBreaks.elementAti(fPositionInCache);
        if (r < fromPos) {
            *result = r;
            *statusIndex = ( r == fStart) ? fFirstRuleStatusIndex : fOtherRuleStatusIndex;
            return TRUE;
        }
    }
    U_ASSERT(FALSE);
    fPositionInCache = -1;
    return FALSE;
}